

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

int __thiscall
duckdb_re2::Compiler::UncachedRuneByteSuffix
          (Compiler *this,uint8_t lo,uint8_t hi,bool foldcase,int next)

{
  Inst *pIVar1;
  PatchList PVar2;
  PatchList PVar3;
  PatchList PVar4;
  undefined7 in_register_00000011;
  PatchList PVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  Frag FVar8;
  uint32_t local_20;
  uint uStack_1c;
  
  FVar8 = ByteRange(this,(int)CONCAT71(in_register_00000031,lo),
                    (int)CONCAT71(in_register_00000011,hi),foldcase);
  local_20 = FVar8.begin;
  uStack_1c = FVar8.end.head;
  pIVar1 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
  if (next == 0) {
    PVar2 = (this->rune_range_).end;
    PVar3 = FVar8.end;
    PVar4 = PVar3;
    PVar5 = PVar3;
    if ((PVar2.head != 0) && (PVar4 = PVar2, PVar5 = PVar2, uStack_1c != 0)) {
      uVar7 = (ulong)PVar2 >> 0x21;
      if (((ulong)PVar2 >> 0x20 & 1) == 0) {
        pIVar1[uVar7].out_opcode_ = pIVar1[uVar7].out_opcode_ & 0xf | uStack_1c << 4;
        PVar5 = PVar3;
      }
      else {
        pIVar1[uVar7].field_1.out1_ = uStack_1c;
        PVar5 = PVar3;
      }
    }
    (this->rune_range_).end =
         (PatchList)((ulong)PVar4 & 0xffffffff | (ulong)PVar5 & 0xffffffff00000000);
  }
  else if (uStack_1c != 0) {
    do {
      uVar6 = uStack_1c >> 1;
      if ((uStack_1c & 1) == 0) {
        uStack_1c = pIVar1[uVar6].out_opcode_ >> 4;
        pIVar1[uVar6].out_opcode_ = pIVar1[uVar6].out_opcode_ & 0xf | next << 4;
      }
      else {
        uStack_1c = pIVar1[uVar6].field_1.out1_;
        pIVar1[uVar6].field_1.cap_ = next;
      }
    } while (uStack_1c != 0);
  }
  return local_20;
}

Assistant:

int Compiler::UncachedRuneByteSuffix(uint8_t lo, uint8_t hi, bool foldcase,
                                     int next) {
  Frag f = ByteRange(lo, hi, foldcase);
  if (next != 0) {
    PatchList::Patch(inst_.data(), f.end, next);
  } else {
    rune_range_.end = PatchList::Append(inst_.data(), rune_range_.end, f.end);
  }
  return f.begin;
}